

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xio.c
# Opt level: O3

OPTIONHANDLER_HANDLE xio_retrieveoptions(XIO_HANDLE xio)

{
  OPTIONHANDLER_RESULT OVar1;
  OPTIONHANDLER_HANDLE handle;
  OPTIONHANDLER_HANDLE handle_00;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  
  if (xio == (XIO_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      pcVar4 = "invalid argument detected: XIO_HANDLE xio=%p";
      iVar3 = 0x105;
LAB_00103d14:
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/xio.c"
                ,"xio_retrieveoptions",iVar3,1,pcVar4);
      return (OPTIONHANDLER_HANDLE)0x0;
    }
  }
  else {
    handle = OptionHandler_Create(xio_CloneOption,xio_DestroyOption,xio_setoption);
    if (handle == (OPTIONHANDLER_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        pcVar4 = "unable to OptionHandler_Create";
        iVar3 = 0x10f;
        goto LAB_00103d14;
      }
    }
    else {
      handle_00 = (*xio->io_interface_description->concrete_io_retrieveoptions)
                            (xio->concrete_xio_handle);
      if (handle_00 != (OPTIONHANDLER_HANDLE)0x0) {
        OVar1 = OptionHandler_AddOption(handle,"concreteOptions",handle_00);
        if (OVar1 != OPTIONHANDLER_OK) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/xio.c"
                      ,"xio_retrieveoptions",0x11f,1,"unable to OptionHandler_AddOption");
          }
          OptionHandler_Destroy(handle);
          handle = (OPTIONHANDLER_HANDLE)0x0;
        }
        OptionHandler_Destroy(handle_00);
        return handle;
      }
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/xio.c"
                  ,"xio_retrieveoptions",0x117,1,"unable to concrete_io_retrieveoptions");
      }
      OptionHandler_Destroy(handle);
    }
  }
  return (OPTIONHANDLER_HANDLE)0x0;
}

Assistant:

OPTIONHANDLER_HANDLE xio_retrieveoptions(XIO_HANDLE xio)
{
    OPTIONHANDLER_HANDLE result;

    if (xio == NULL)
    {
        LogError("invalid argument detected: XIO_HANDLE xio=%p", xio);
        result = NULL;
    }
    else
    {
        XIO_INSTANCE* xio_instance = (XIO_INSTANCE*)xio;
        /*xio_retrieveoptions shall return a OPTIONHANDLER_HANDLE that has 1 option called "underlyingOptions" which is of type OPTIONHANDLER_HANDLE*/
        result = OptionHandler_Create(xio_CloneOption, xio_DestroyOption, (pfSetOption)xio_setoption);
        if (result == NULL)
        {
            LogError("unable to OptionHandler_Create");
            /*return as is*/
        }
        else
        {
            OPTIONHANDLER_HANDLE concreteOptions = xio_instance->io_interface_description->concrete_io_retrieveoptions(xio_instance->concrete_xio_handle);
            if (concreteOptions == NULL)
            {
                LogError("unable to concrete_io_retrieveoptions");
                OptionHandler_Destroy(result);
                result = NULL;
            }
            else
            {
                if (OptionHandler_AddOption(result, CONCRETE_OPTIONS, concreteOptions) != OPTIONHANDLER_OK)
                {
                    LogError("unable to OptionHandler_AddOption");
                    OptionHandler_Destroy(result);
                    result = NULL;
                }
                else
                {
                    /*all is fine*/
                }
                
                // Must destroy since OptionHandler_AddOption creates a copy of it.
                OptionHandler_Destroy(concreteOptions);
            }
        }
    }

    return result;
}